

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.h
# Opt level: O3

void __thiscall
ccs::Loader::loadCcsStream
          (Loader *this,istream *stream,string *fileName,DagBuilder *dag,
          ImportResolver *importResolver)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inProgress;
  Nested ast;
  P local_78;
  P local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  Nested local_40;
  
  local_40.super_AstRule._vptr_AstRule = (_func_int **)&PTR__Nested_001a8488;
  local_40.selector_.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_40.selector_.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40.rules_.
  super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.rules_.
  super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40.rules_.
  super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = parseCcsStream(this,stream,fileName,importResolver,&local_58,&local_40);
  if (bVar1) {
    local_68.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (dag->buildContext_).super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_68.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (dag->buildContext_).super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_68.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_78.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_78.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_68.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_68.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_68.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_68.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_68.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
      }
      local_78.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (dag->buildContext_).super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_78.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (dag->buildContext_).super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_78.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_78.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_78.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_78.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_78.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
    }
    ccs::ast::Nested::addTo(&local_40,&local_68,&local_78);
    if (local_78.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_68.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  local_40.super_AstRule._vptr_AstRule = (_func_int **)&PTR__Nested_001a8488;
  std::
  vector<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
  ::~vector(&local_40.rules_);
  if (local_40.selector_.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.selector_.
               super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void loadCcsStream(std::istream &stream, const std::string &fileName,
      DagBuilder &dag, ImportResolver &importResolver) {
    ast::Nested ast;
    std::vector<std::string> inProgress;
    if (parseCcsStream(stream, fileName, importResolver, inProgress, ast)) {
      // everything parsed, no errors. now it's safe to modify the dag...
      ast.addTo(dag.buildContext(), dag.buildContext());
    }
    // otherwise, errors already reported, don't modify the dag...
  }